

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::Destroy(AActor *this)

{
  Self local_14;
  AActor *local_10;
  AActor *this_local;
  
  local_10 = this;
  ClearRenderSectorList(this);
  ClearRenderLineList(this);
  DestroyAllInventory(this);
  RemoveFromHash(this);
  UnlinkFromWorld(this);
  ::operator|((EnumType)&local_14,MF_NOSECTOR);
  TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,&local_14);
  P_DelSector_List();
  S_RelinkSound(this,(AActor *)0x0);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void AActor::Destroy ()
{
	ClearRenderSectorList();
	ClearRenderLineList();

	// [RH] Destroy any inventory this actor is carrying
	DestroyAllInventory ();

	// [RH] Unlink from tid chain
	RemoveFromHash ();

	// unlink from sector and block lists
	UnlinkFromWorld ();
	flags |= MF_NOSECTOR|MF_NOBLOCKMAP;

	// Delete all nodes on the current sector_list			phares 3/16/98
	P_DelSector_List();

	// Transform any playing sound into positioned, non-actor sounds.
	S_RelinkSound (this, NULL);

	Super::Destroy ();
}